

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vlvg(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  MemOp_conflict MVar2;
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *ts;
  MemOp_conflict memop;
  byte es;
  
  uVar1 = (s->fields).presentO;
  if ((uVar1 & 0x20) != 0) {
    MVar2 = (s->fields).c[3];
    memop = MVar2 & 0xff;
    if (MO_64 < memop) {
      gen_program_exception(s,6);
      return DISAS_NORETURN;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      tcg_ctx = s->uc->tcg_ctx;
      es = (byte)MVar2;
      if ((s->fields).c[1] == 0) {
        if (((uVar1 >> 0xc & 1) != 0) && ((uVar1 >> 0x16 & 1) != 0)) {
          write_vec_element_i64
                    (tcg_ctx,o->in2,(s->fields).c[0],
                     (char)(0x10 >> (es & 0x1f)) - 1U & (byte)(s->fields).c[5],memop);
          return DISAS_NEXT;
        }
      }
      else {
        ts = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
        if (((s->fields).presentO & 0x400000) != 0) {
          get_vec_element_ptr_i64
                    (tcg_ctx,(TCGv_ptr)((long)ts - (long)tcg_ctx),(uint8_t)(s->fields).c[0],o->addr1
                     ,es);
          tcg_gen_op3_s390x(tcg_ctx,memop + (MO_ALIGN_16|MO_BEUL),(TCGArg)(o->in2 + (long)tcg_ctx),
                            (TCGArg)ts,0);
          tcg_temp_free_internal_s390x(tcg_ctx,ts);
          return DISAS_NEXT;
        }
      }
    }
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vlvg(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m4);
    TCGv_ptr ptr;

    if (es > ES_64) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    /* fast path if we don't need the register content */
    if (!get_field(s, b2)) {
        uint8_t enr = get_field(s, d2) & (NUM_VEC_ELEMENTS(es) - 1);

        write_vec_element_i64(tcg_ctx, o->in2, get_field(s, v1), enr, es);
        return DISAS_NEXT;
    }

    ptr = tcg_temp_new_ptr(tcg_ctx);
    get_vec_element_ptr_i64(tcg_ctx, ptr, get_field(s, v1), o->addr1, es);
    switch (es) {
    case ES_8:
        tcg_gen_st8_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_16:
        tcg_gen_st16_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_32:
        tcg_gen_st32_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    case ES_64:
        tcg_gen_st_i64(tcg_ctx, o->in2, ptr, 0);
        break;
    default:
        // g_assert_not_reached();
        break;
    }
    tcg_temp_free_ptr(tcg_ctx, ptr);

    return DISAS_NEXT;
}